

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encrypt.c
# Opt level: O0

_Bool COSE_Enveloped_SetContent(HCOSE_ENVELOPED h,byte *rgb,size_t cb,cose_errback *perr)

{
  _Bool _Var1;
  cose_errback *perr_local;
  size_t cb_local;
  byte *rgb_local;
  HCOSE_ENVELOPED h_local;
  
  _Var1 = IsValidEnvelopedHandle(h);
  if (_Var1) {
    if (rgb != (byte *)0x0) {
      _Var1 = _COSE_Enveloped_SetContent((COSE_Enveloped *)h,rgb,cb,perr);
      return _Var1;
    }
    if (perr != (cose_errback *)0x0) {
      perr->err = COSE_ERR_INVALID_PARAMETER;
    }
  }
  else if (perr != (cose_errback *)0x0) {
    perr->err = COSE_ERR_INVALID_HANDLE;
  }
  return false;
}

Assistant:

bool COSE_Enveloped_SetContent(HCOSE_ENVELOPED h, const byte * rgb, size_t cb, cose_errback * perr)
{
	CHECK_CONDITION(IsValidEnvelopedHandle(h), COSE_ERR_INVALID_HANDLE);
	CHECK_CONDITION(rgb != NULL, COSE_ERR_INVALID_PARAMETER);

	return _COSE_Enveloped_SetContent((COSE_Enveloped *)h, rgb, cb, perr);

errorReturn:
	return false;
}